

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSamplerCustomBorderColorCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerCustomBorderColorCreateInfoEXT>
          (Impl *this,VkSamplerCustomBorderColorCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkSamplerCustomBorderColorCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSamplerCustomBorderColorCreateInfoEXT>(alloc,count);
    if (pVVar1 != (VkSamplerCustomBorderColorCreateInfoEXT *)0x0) {
      pVVar1 = (VkSamplerCustomBorderColorCreateInfoEXT *)memmove(pVVar1,src,count * 0x28);
      return pVVar1;
    }
  }
  return (VkSamplerCustomBorderColorCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}